

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_in_parallel_(void)

{
  kmp_info_t *pkVar1;
  int iVar2;
  
  iVar2 = __kmp_get_global_thread_id_reg();
  pkVar1 = __kmp_threads[iVar2];
  if ((pkVar1->th).th_teams_microtask == (microtask_t)0x0) {
    iVar2 = (((pkVar1->th).th_root)->r).r_in_parallel.super___atomic_base<int>._M_i;
  }
  else {
    iVar2 = (((pkVar1->th).th_team)->t).t_active_level;
  }
  return (int)(iVar2 != 0);
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_IN_PARALLEL)(void) {
#ifdef KMP_STUB
  return 0;
#else
  kmp_info_t *th = __kmp_entry_thread();
  if (th->th.th_teams_microtask) {
    // AC: r_in_parallel does not work inside teams construct where real
    // parallel is inactive, but all threads have same root, so setting it in
    // one team affects other teams.
    // The solution is to use per-team nesting level
    return (th->th.th_team->t.t_active_level ? 1 : 0);
  } else
    return (th->th.th_root->r.r_in_parallel ? FTN_TRUE : FTN_FALSE);
#endif
}